

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<char_const(&)[6],unsigned_int,char_const(&)[3],unsigned_int,char_const(&)[2]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [6],uint *params_1,
          char (*params_2) [3],uint *params_3,char (*params_4) [2])

{
  ArrayPtr<const_char> *in_stack_ffffffffffffff68;
  CappedArray<char,_14UL> local_90;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  CappedArray<char,_14UL> local_48;
  
  local_58 = toCharSequence<char_const(&)[6]>((char (*) [6])this);
  toCharSequence<unsigned_int>(&local_90,(uint *)params);
  local_68 = toCharSequence<char_const(&)[3]>((char (*) [3])params_1);
  toCharSequence<unsigned_int>(&local_48,(uint *)params_2);
  local_78 = toCharSequence<char_const(&)[2]>((char (*) [2])params_3);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_58,(ArrayPtr<const_char> *)&local_90,
             (CappedArray<char,_14UL> *)&local_68,(ArrayPtr<const_char> *)&local_48,
             (CappedArray<char,_14UL> *)&local_78,in_stack_ffffffffffffff68);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}